

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O2

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddSelect
          (InstructionBuilder *this,uint32_t type,uint32_t cond,uint32_t true_value,
          uint32_t false_value)

{
  IRContext *this_00;
  uint32_t res_id;
  tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_> this_01;
  Instruction *pIVar1;
  long lVar2;
  undefined4 uVar3;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  __uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  local_168;
  uint32_t local_15c;
  uint32_t local_158;
  uint32_t local_154;
  SmallVector<unsigned_int,_2UL> local_150;
  SmallVector<unsigned_int,_2UL> local_128;
  SmallVector<unsigned_int,_2UL> local_100;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined1 local_c0 [48];
  undefined4 local_90;
  SmallVector<unsigned_int,_2UL> local_88;
  undefined4 local_60;
  SmallVector<unsigned_int,_2UL> local_58;
  
  this_01.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        )::operator_new(0x70);
  this_00 = this->context_;
  res_id = IRContext::TakeNextId(this_00);
  init_list._M_len = 1;
  init_list._M_array = &local_154;
  local_154 = cond;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_100,init_list);
  uVar3 = 1;
  local_c0._0_4_ = uVar3;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_c0 + 8),&local_100);
  init_list_00._M_len = 1;
  init_list_00._M_array = &local_158;
  local_158 = true_value;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_128,init_list_00);
  local_90 = uVar3;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88,&local_128);
  init_list_01._M_len = 1;
  init_list_01._M_array = &local_15c;
  local_15c = false_value;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_150,init_list_01);
  local_60 = uVar3;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,&local_150);
  local_d8 = 0;
  uStack_d0 = 0;
  local_c8 = 0;
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  _M_range_initialize<spvtools::opt::Operand_const*>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_d8,
             local_c0,&stack0xffffffffffffffd0);
  Instruction::Instruction
            ((Instruction *)
             this_01.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,this_00,
             OpSelect,type,res_id,(OperandList *)&local_d8);
  local_168._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       (tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>)
       (tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>)
       this_01.
       super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
       .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_d8);
  lVar2 = 0x68;
  do {
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector
              ((SmallVector<unsigned_int,_2UL> *)(local_c0 + lVar2));
    lVar2 = lVar2 + -0x30;
  } while (lVar2 != -0x28);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_150);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_128);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_100);
  pIVar1 = AddInstruction(this,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                *)&local_168);
  if (local_168._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
       )0x0) {
    (**(code **)(*(long *)local_168._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl +
                8))();
  }
  return pIVar1;
}

Assistant:

Instruction* AddSelect(uint32_t type, uint32_t cond, uint32_t true_value,
                         uint32_t false_value) {
    // TODO(1841): Handle id overflow.
    std::unique_ptr<Instruction> select(new Instruction(
        GetContext(), spv::Op::OpSelect, type, GetContext()->TakeNextId(),
        std::initializer_list<Operand>{{SPV_OPERAND_TYPE_ID, {cond}},
                                       {SPV_OPERAND_TYPE_ID, {true_value}},
                                       {SPV_OPERAND_TYPE_ID, {false_value}}}));
    return AddInstruction(std::move(select));
  }